

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O0

void __thiscall
ritobin::io::text_write_impl::TextWriter::write<unsigned_short>
          (TextWriter *this,unsigned_short value)

{
  vector<char,std::allocator<char>> *this_00;
  iterator __first;
  iterator __last;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  const_iterator local_40;
  undefined1 local_38 [8];
  string result;
  unsigned_short value_local;
  TextWriter *this_local;
  
  result.field_2._14_2_ = value;
  std::__cxx11::string::string((string *)local_38);
  from_num<unsigned_short>
            ((string *)local_38,(unsigned_short *)(result.field_2._M_local_buf + 0xe),10);
  this_00 = (vector<char,std::allocator<char>> *)this->buffer_;
  local_48._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)this_00);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_40,
             &local_48);
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      ((string *)local_38);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((string *)local_38);
  std::vector<char,std::allocator<char>>::
  insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            (this_00,local_40,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_current);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void write(T value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            std::string result;
            from_num(result, value);
            buffer_.insert(buffer_.end(), result.begin(), result.end());
        }